

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImFont::RenderChar(ImFont *this,ImDrawList *draw_list,float size,ImVec2 pos,ImU32 col,ImWchar c)

{
  ImDrawList *this_00;
  float local_6c;
  ImVec2 local_5c;
  ImVec2 local_54;
  ImVec2 local_4c;
  ImVec2 local_44;
  float local_3c;
  ImFontGlyph *pIStack_38;
  float scale;
  ImFontGlyph *glyph;
  ImU32 local_28;
  float fStack_24;
  ImWchar c_local;
  ImU32 col_local;
  float size_local;
  ImDrawList *draw_list_local;
  ImFont *this_local;
  ImVec2 pos_local;
  
  if ((((c != 0x20) && (c != 9)) && (c != 10)) &&
     ((c != 0xd &&
      (glyph._6_2_ = c, local_28 = col, fStack_24 = size, _col_local = draw_list,
      draw_list_local = (ImDrawList *)this, this_local = (ImFont *)pos,
      pIStack_38 = FindGlyph(this,c), pIStack_38 != (ImFontGlyph *)0x0)))) {
    if (fStack_24 < 0.0) {
      local_6c = 1.0;
    }
    else {
      local_6c = fStack_24 / this->FontSize;
    }
    local_3c = local_6c;
    this_local = (ImFont *)
                 CONCAT44((float)(int)this_local._4_4_ + (this->DisplayOffset).y,
                          (float)(int)this_local._0_4_ + (this->DisplayOffset).x);
    ImDrawList::PrimReserve(_col_local,6,4);
    this_00 = _col_local;
    ImVec2::ImVec2(&local_44,pIStack_38->X0 * local_3c + this_local._0_4_,
                   pIStack_38->Y0 * local_3c + this_local._4_4_);
    ImVec2::ImVec2(&local_4c,pIStack_38->X1 * local_3c + this_local._0_4_,
                   pIStack_38->Y1 * local_3c + this_local._4_4_);
    ImVec2::ImVec2(&local_54,pIStack_38->U0,pIStack_38->V0);
    ImVec2::ImVec2(&local_5c,pIStack_38->U1,pIStack_38->V1);
    ImDrawList::PrimRectUV(this_00,&local_44,&local_4c,&local_54,&local_5c,local_28);
  }
  return;
}

Assistant:

void ImFont::RenderChar(ImDrawList* draw_list, float size, ImVec2 pos, ImU32 col, ImWchar c) const
{
    if (c == ' ' || c == '\t' || c == '\n' || c == '\r') // Match behavior of RenderText(), those 4 codepoints are hard-coded.
        return;
    if (const ImFontGlyph* glyph = FindGlyph(c))
    {
        float scale = (size >= 0.0f) ? (size / FontSize) : 1.0f;
        pos.x = (float)(int)pos.x + DisplayOffset.x;
        pos.y = (float)(int)pos.y + DisplayOffset.y;
        draw_list->PrimReserve(6, 4);
        draw_list->PrimRectUV(ImVec2(pos.x + glyph->X0 * scale, pos.y + glyph->Y0 * scale), ImVec2(pos.x + glyph->X1 * scale, pos.y + glyph->Y1 * scale), ImVec2(glyph->U0, glyph->V0), ImVec2(glyph->U1, glyph->V1), col);
    }
}